

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O3

xml_attribute __thiscall
pugi::xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
          (xml_node *this,namespace_uri_predicate pred)

{
  xml_node_struct *pxVar1;
  size_t sVar2;
  char_t *pcVar3;
  long lVar4;
  size_t sVar5;
  char_t cVar6;
  
  sVar2 = pred.prefix_length;
  if (this != (xml_node *)0x0) {
    for (pxVar1 = this[7]._root; pxVar1 != (xml_node_struct *)0x0; pxVar1 = pxVar1->first_child) {
      pcVar3 = pxVar1->name;
      cVar6 = 'x';
      if (pcVar3 == (char_t *)0x0) {
        pcVar3 = "";
      }
      lVar4 = 0;
      do {
        if (pcVar3[lVar4] != cVar6) goto LAB_00115c98;
        cVar6 = "xmlns"[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
      cVar6 = pcVar3[5];
      if (pred.prefix == (char_t *)0x0) {
joined_r0x00115c96:
        if (cVar6 == '\0') {
          return (xml_attribute)(xml_attribute_struct *)pxVar1;
        }
      }
      else if (cVar6 == ':') {
        if (sVar2 != 0) {
          sVar5 = 0;
          do {
            if (pcVar3[sVar5 + 6] != pred.prefix[sVar5]) goto LAB_00115c98;
            sVar5 = sVar5 + 1;
          } while (sVar2 != sVar5);
        }
        cVar6 = pcVar3[sVar2 + 6];
        goto joined_r0x00115c96;
      }
LAB_00115c98:
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}